

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

void StoreHuffmanCode(VP8LBitWriter *bw,HuffmanTree *huff_tree,HuffmanTreeToken *tokens,
                     HuffmanTreeCode *huffman_code)

{
  int *in_RCX;
  int kMaxSymbol;
  int kMaxBits;
  int symbols [2];
  int count;
  int i;
  HuffmanTreeCode *in_stack_000000b8;
  HuffmanTreeToken *in_stack_000000c0;
  HuffmanTree *in_stack_000000c8;
  VP8LBitWriter *in_stack_000000d0;
  int in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar1;
  int local_30 [4];
  int *local_20;
  
  local_30[2] = 0;
  local_20 = in_RCX;
  memset(local_30,0,8);
  for (local_30[3] = 0; uVar1 = local_30[3] < *local_20 && local_30[2] < 3,
      local_30[3] < *local_20 && local_30[2] < 3; local_30[3] = local_30[3] + 1) {
    if (*(char *)(*(long *)(local_20 + 2) + (long)local_30[3]) != '\0') {
      if (local_30[2] < 2) {
        local_30[local_30[2]] = local_30[3];
      }
      local_30[2] = local_30[2] + 1;
    }
  }
  if (local_30[2] == 0) {
    VP8LPutBits((VP8LBitWriter *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc
                ,in_stack_ffffffffffffffb8);
  }
  else if (((local_30[2] < 3) && (local_30[0] < 0x100)) && (local_30[1] < 0x100)) {
    VP8LPutBits((VP8LBitWriter *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc
                ,in_stack_ffffffffffffffb8);
    VP8LPutBits((VP8LBitWriter *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc
                ,in_stack_ffffffffffffffb8);
    if (local_30[0] < 2) {
      VP8LPutBits((VP8LBitWriter *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      VP8LPutBits((VP8LBitWriter *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    }
    else {
      VP8LPutBits((VP8LBitWriter *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      VP8LPutBits((VP8LBitWriter *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    }
    if (local_30[2] == 2) {
      VP8LPutBits((VP8LBitWriter *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    }
  }
  else {
    StoreFullHuffmanCode(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
  }
  return;
}

Assistant:

static void StoreHuffmanCode(VP8LBitWriter* const bw,
                             HuffmanTree* const huff_tree,
                             HuffmanTreeToken* const tokens,
                             const HuffmanTreeCode* const huffman_code) {
  int i;
  int count = 0;
  int symbols[2] = { 0, 0 };
  const int kMaxBits = 8;
  const int kMaxSymbol = 1 << kMaxBits;

  // Check whether it's a small tree.
  for (i = 0; i < huffman_code->num_symbols && count < 3; ++i) {
    if (huffman_code->code_lengths[i] != 0) {
      if (count < 2) symbols[count] = i;
      ++count;
    }
  }

  if (count == 0) {   // emit minimal tree for empty cases
    // bits: small tree marker: 1, count-1: 0, large 8-bit code: 0, code: 0
    VP8LPutBits(bw, 0x01, 4);
  } else if (count <= 2 && symbols[0] < kMaxSymbol && symbols[1] < kMaxSymbol) {
    VP8LPutBits(bw, 1, 1);  // Small tree marker to encode 1 or 2 symbols.
    VP8LPutBits(bw, count - 1, 1);
    if (symbols[0] <= 1) {
      VP8LPutBits(bw, 0, 1);  // Code bit for small (1 bit) symbol value.
      VP8LPutBits(bw, symbols[0], 1);
    } else {
      VP8LPutBits(bw, 1, 1);
      VP8LPutBits(bw, symbols[0], 8);
    }
    if (count == 2) {
      VP8LPutBits(bw, symbols[1], 8);
    }
  } else {
    StoreFullHuffmanCode(bw, huff_tree, tokens, huffman_code);
  }
}